

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptParameterDeclaration(HlslGrammar *this,TFunction *function)

{
  HlslParseContext *pHVar1;
  bool bVar2;
  int iVar3;
  TType *this_00;
  undefined4 extraout_var;
  char *pcVar4;
  TAttributes *attributes_00;
  undefined8 local_a0;
  TParameter param;
  TIntermTyped *defaultValue;
  TArraySizes *arraySizes;
  HlslToken idToken;
  TType *type;
  TAttributes attributes;
  TFunction *function_local;
  HlslGrammar *this_local;
  
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node._M_size = (size_t)function;
  TList<glslang::TAttributeArgs>::TList((TList<glslang::TAttributeArgs> *)&type);
  attributes_00 = (TAttributes *)&type;
  acceptAttributes(this,attributes_00);
  this_00 = (TType *)TType::operator_new((TType *)0x98,(size_t)attributes_00);
  TType::TType(this_00,EbtVoid,EvqTemporary,1,0,0,false);
  bVar2 = acceptFullySpecifiedType(this,this_00,(TAttributes *)&type);
  if (bVar2) {
    HlslParseContext::transferTypeAttributes
              (this->parseContext,&(this->super_HlslTokenStream).token.loc,(TAttributes *)&type,
               this_00,false);
    HlslToken::HlslToken((HlslToken *)&arraySizes);
    acceptIdentifier(this,(HlslToken *)&arraySizes);
    defaultValue = (TIntermTyped *)0x0;
    acceptArraySpecifier(this,(TArraySizes **)&defaultValue);
    if (defaultValue != (TIntermTyped *)0x0) {
      bVar2 = TArraySizes::hasUnsized((TArraySizes *)defaultValue);
      if (bVar2) {
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,
                  "function parameter requires array size","[]","");
        this_local._7_1_ = false;
        goto LAB_005ac016;
      }
      TType::transferArraySizes(this_00,(TArraySizes *)defaultValue);
    }
    iVar3 = (*this_00->_vptr_TType[10])();
    acceptPostDecls(this,(TQualifier *)CONCAT44(extraout_var,iVar3));
    bVar2 = acceptDefaultParameterDeclaration(this,this_00,&param.defaultValue);
    if (bVar2) {
      HlslParseContext::paramFix(this->parseContext,this_00);
      if (param.defaultValue == (TIntermTyped *)0x0) {
        iVar3 = (**(code **)(*(long *)attributes.
                                      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                                      .
                                      super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                                      ._M_impl._M_node._M_size + 0x128))();
        if (0 < iVar3) {
          pHVar1 = this->parseContext;
          pcVar4 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)idToken._24_8_);
          (*(pHVar1->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pHVar1,&arraySizes,"invalid parameter after default value parameters",pcVar4,""
                    );
          this_local._7_1_ = false;
          goto LAB_005ac016;
        }
      }
      local_a0._0_4_ = idToken.tokenClass;
      local_a0._4_4_ = idToken._28_4_;
      param.type = (TType *)param.defaultValue;
      param.name = (TString *)this_00;
      (**(code **)(*(long *)attributes.
                            super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                            .
                            super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                            ._M_impl._M_node._M_size + 0xb0))
                (attributes.
                 super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                 .
                 super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                 ._M_impl._M_node._M_size,&local_a0);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_005ac016:
  idToken.field_2._4_4_ = 1;
  TList<glslang::TAttributeArgs>::~TList((TList<glslang::TAttributeArgs> *)&type);
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptParameterDeclaration(TFunction& function)
{
    // attributes
    TAttributes attributes;
    acceptAttributes(attributes);

    // fully_specified_type
    TType* type = new TType;
    if (! acceptFullySpecifiedType(*type, attributes))
        return false;

    // merge in the attributes
    parseContext.transferTypeAttributes(token.loc, attributes, *type);

    // identifier
    HlslToken idToken;
    acceptIdentifier(idToken);

    // array_specifier
    TArraySizes* arraySizes = nullptr;
    acceptArraySpecifier(arraySizes);
    if (arraySizes) {
        if (arraySizes->hasUnsized()) {
            parseContext.error(token.loc, "function parameter requires array size", "[]", "");
            return false;
        }

        type->transferArraySizes(arraySizes);
    }

    // post_decls
    acceptPostDecls(type->getQualifier());

    TIntermTyped* defaultValue;
    if (!acceptDefaultParameterDeclaration(*type, defaultValue))
        return false;

    parseContext.paramFix(*type);

    // If any prior parameters have default values, all the parameters after that must as well.
    if (defaultValue == nullptr && function.getDefaultParamCount() > 0) {
        parseContext.error(idToken.loc, "invalid parameter after default value parameters", idToken.string->c_str(), "");
        return false;
    }

    TParameter param = { idToken.string, type, defaultValue };
    function.addParameter(param);

    return true;
}